

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_string(void)

{
  char cVar1;
  XSValue *this;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  Status myStatus;
  char v_1 [9];
  Status local_54;
  StrX local_50;
  char local_40 [16];
  
  builtin_strncpy(local_40,"mystring",9);
  local_54 = st_Init;
  local_50.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_50.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_50.fUnicodeForm,dt_string,&local_54,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_50);
  if (cVar1 == '\0') {
    StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x132e,local_40,local_50.fLocalForm,1);
    StrX::~StrX(&local_50);
    errSeen = 1;
  }
  iVar5 = 1;
  do {
    local_54 = st_Init;
    local_50.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    this = (XSValue *)
           xercesc_4_0::XSValue::getActualValue
                     (local_50.fUnicodeForm,dt_string,&local_54,ver_10,iVar5 == 1,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_50);
    if (this == (XSValue *)0x0) {
      if (local_54 != st_NoActVal) {
        StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
        pcVar4 = "st_UnknownType";
        if ((ulong)local_54 < 0xb) {
          pcVar4 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_54];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x134a,local_40,local_50.fLocalForm,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_50);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
      pvVar3 = (void *)0x134a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x134a,local_40);
      StrX::~StrX(&local_50);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(this);
      xercesc_4_0::XMemory::operator_delete((XMemory *)this,pvVar3);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 == 0);
  iVar5 = 1;
  do {
    local_54 = st_Init;
    local_50.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar2 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_50.fUnicodeForm,dt_string,&local_54,ver_10,iVar5 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_50);
    if (lVar2 == 0) {
      if (local_54 != st_NoCanRep) {
        StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
        pcVar4 = "st_UnknownType";
        if ((ulong)local_54 < 0xb) {
          pcVar4 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_54];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1368,local_40,local_50.fLocalForm,"st_NoCanRep",pcVar4);
        StrX::~StrX(&local_50);
        goto LAB_0012e0a1;
      }
    }
    else {
      StrX::StrX(&local_50,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1368,local_40);
      StrX::~StrX(&local_50);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar2);
LAB_0012e0a1:
      errSeen = 1;
    }
    iVar5 = iVar5 + -1;
    if (iVar5 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_string()
{
    const XSValue::DataType dt = XSValue::dt_string;
    bool  toValidate = true;

    const char v_1[]="mystring";
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                     n/a             false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);

        //  invalid
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid

    }

}